

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::write_key_and_integer(t_json_generator *this,string *key,int val)

{
  ostream *poVar1;
  string local_70;
  string local_40;
  int local_1c;
  string *psStack_18;
  int val_local;
  string *key_local;
  t_json_generator *this_local;
  
  local_1c = val;
  psStack_18 = key;
  key_local = (string *)this;
  write_comma_if_needed(this);
  poVar1 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_json_);
  json_str(&local_40,this,key);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,": ");
  number_to_string<int>(&local_70,this,local_1c);
  std::operator<<(poVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  indicate_comma_needed(this);
  return;
}

Assistant:

void t_json_generator::write_key_and_integer(string key, int val) {
  write_comma_if_needed();
  indent(f_json_) << json_str(key) << ": " << number_to_string(val);
  indicate_comma_needed();
}